

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::reserve
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this,
          size_t capacity)

{
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar1;
  uint uVar2;
  void **head;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar3;
  ulong uVar4;
  
  if (capacity <= this->_capacity) {
    return;
  }
  uVar4 = capacity * 0x20;
  if (uVar4 == 0) {
    pMVar1 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar4 < 0x21) {
    pMVar1 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar4 < 0x31) {
    pMVar1 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar4 < 0x41) {
    pMVar1 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pMVar1 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)::operator_new(uVar4,0x10);
  }
  pMVar3 = this->_stack;
  if (pMVar3 == (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0) {
    this->_stack = pMVar1;
    this->_cursor = pMVar1;
    this->_capacity = capacity;
    goto LAB_0048e7a2;
  }
  if (this->_cursor == pMVar3) {
LAB_0048e6fd:
    uVar4 = this->_capacity << 5;
    if (uVar4 == 0) {
      (pMVar3->numeral)._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      (pMVar3->numeral)._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pMVar3;
    }
    else if (uVar4 < 0x21) {
      (pMVar3->numeral)._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      (pMVar3->numeral)._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pMVar3;
    }
    else if (uVar4 < 0x31) {
      (pMVar3->numeral)._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      (pMVar3->numeral)._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pMVar3;
    }
    else if (uVar4 < 0x41) {
      (pMVar3->numeral)._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      (pMVar3->numeral)._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pMVar3;
    }
    else {
      operator_delete(pMVar3,0x10);
    }
  }
  else {
    uVar2 = 1;
    uVar4 = 0;
    do {
      Kernel::IntegerConstantType::IntegerConstantType
                (&pMVar1[uVar4].numeral,&pMVar3[uVar4].numeral);
      pMVar1[uVar4].factors._id = pMVar3[uVar4].factors._id;
      pMVar1[uVar4].factors._ptr = pMVar3[uVar4].factors._ptr;
      pMVar3 = this->_stack;
      uVar4 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar4 < (ulong)((long)this->_cursor - (long)pMVar3 >> 5));
    if (pMVar3 != (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0) goto LAB_0048e6fd;
  }
  this->_cursor =
       (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
       (((long)this->_cursor - (long)this->_stack) + (long)pMVar1);
  this->_capacity = capacity;
  this->_stack = pMVar1;
LAB_0048e7a2:
  this->_end = pMVar1 + capacity;
  return;
}

Assistant:

inline
  void reserve(size_t capacity) 
  {
    if (_capacity >= capacity) {
      return;
    }
    C* mem = static_cast<C*>(ALLOC_KNOWN(capacity*sizeof(C),className()));
    if (_stack) {
      for (unsigned i = 0; i < size(); i++) {
        ::new(&mem[i]) C(std::move((*this)[i]));
      }
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());

      _cursor = mem + (_cursor - _stack);
      _capacity = capacity;
      _stack = mem;
      _end = _stack + _capacity;
    } else {
      _stack = mem;
      _cursor = mem;
      _capacity = capacity;
      _end = _stack + _capacity;
    }
  }